

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void io::detail::parse_line<io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>>
               (char *line,char **sorted_col,vector<int,_std::allocator<int>_> *col_order)

{
  char *pcVar1;
  ulong uVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  size_type sVar4;
  too_few_columns *this;
  const_reference pvVar5;
  too_many_columns *this_00;
  char *local_48;
  char *col_end;
  char *col_begin;
  ulong local_28;
  size_t i;
  vector<int,_std::allocator<int>_> *col_order_local;
  char **sorted_col_local;
  char *line_local;
  
  local_28 = 0;
  i = (size_t)col_order;
  col_order_local = (vector<int,_std::allocator<int>_> *)sorted_col;
  sorted_col_local = (char **)line;
  while( true ) {
    uVar2 = local_28;
    sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)i);
    if (sVar4 <= uVar2) {
      if (sorted_col_local != (char **)0x0) {
        this_00 = (too_many_columns *)__cxa_allocate_exception();
        memset(this_00,0,0x210);
        error::too_many_columns::too_many_columns(this_00);
        __cxa_throw(this_00,&error::too_many_columns::typeinfo,
                    error::too_many_columns::~too_many_columns);
      }
      return;
    }
    if (sorted_col_local == (char **)0x0) break;
    chop_next_column<io::no_quote_escape<(char)44>>((char **)&sorted_col_local,&col_end,&local_48);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)i,local_28);
    if (*pvVar5 != -1) {
      trim_chars<'_',_'\t'>::trim(&col_end,&local_48);
      no_quote_escape<','>::unescape(&col_end,&local_48);
      pvVar3 = col_order_local;
      pcVar1 = col_end;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)i,local_28);
      (&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start)[*pvVar5] = (pointer)pcVar1;
    }
    local_28 = local_28 + 1;
  }
  this = (too_few_columns *)__cxa_allocate_exception();
  memset(this,0,0x210);
  error::too_few_columns::too_few_columns(this);
  __cxa_throw(this,&error::too_few_columns::typeinfo,error::too_few_columns::~too_few_columns);
}

Assistant:

void parse_line(
                        char*line,
                        char**sorted_col,
                        const std::vector<int>&col_order
                ){
                        for(std::size_t i=0; i<col_order.size(); ++i){
                                if(line == nullptr)
                                        throw ::io::error::too_few_columns();
                                char*col_begin, *col_end;
                                chop_next_column<quote_policy>(line, col_begin, col_end);

                                if(col_order[i] != -1){
                                        trim_policy::trim(col_begin, col_end);
                                        quote_policy::unescape(col_begin, col_end);
                                                               
                                        sorted_col[col_order[i]] = col_begin;
                                }
                        }
                        if(line != nullptr)
                                throw ::io::error::too_many_columns();
                }